

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviz.cpp
# Opt level: O2

ostream * ccs::anon_unknown_1::operator<<(ostream *os,Streamer *ss)

{
  char cVar1;
  Style *pSVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  
  pSVar2 = ss->style;
  if ((pSVar2->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    if (ss->root == false) {
      std::operator<<(os,'[');
      pSVar2 = ss->style;
    }
    p_Var3 = (pSVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar4 = true;
    while ((_Rb_tree_header *)p_Var3 != &(pSVar2->_M_t)._M_impl.super__Rb_tree_header) {
      if ((!bVar4) && (ss->root == false)) {
        std::operator<<(os,", ");
      }
      std::operator<<(os,(string *)(p_Var3 + 1));
      std::operator<<(os,"=\"");
      pcVar5 = *(char **)(p_Var3 + 2);
      for (pcVar6 = pcVar5; pcVar6 != pcVar5 + (long)p_Var3[2]._M_parent; pcVar6 = pcVar6 + 1) {
        cVar1 = *pcVar6;
        if (cVar1 == '\t') {
          pcVar5 = "\\t";
LAB_0012b940:
          std::operator<<(os,pcVar5);
        }
        else {
          if (cVar1 == '\n') {
            pcVar5 = "\\n";
            goto LAB_0012b940;
          }
          if (cVar1 == '\"') {
            pcVar5 = "\\\"";
            goto LAB_0012b940;
          }
          std::operator<<(os,cVar1);
        }
        pcVar5 = *(char **)(p_Var3 + 2);
      }
      std::operator<<(os,'\"');
      if (ss->root != false) {
        std::operator<<(os,";");
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      bVar4 = false;
      pSVar2 = ss->style;
    }
    if (ss->root == false) {
      std::operator<<(os,']');
    }
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Streamer &ss) {
    if (!ss.style.empty()) {
      bool first = true;
      if (!ss.root) os << '[';
      for (auto it = ss.style.cbegin(); it != ss.style.cend(); ++it) {
        if (!first && !ss.root) os << ", ";
        first = false;
        os << it->first;
        os << "=\"";
        for (auto cit = it->second.cbegin(); cit != it->second.cend(); ++cit) {
          switch (*cit) {
            default: os << *cit; break;
            case '"': os << "\\\""; break;
            case '\n': os << "\\n"; break;
            case '\t': os << "\\t"; break;
          }
        }
        os << '"';
        if (ss.root) os << ";";
      }
      if (!ss.root) os << ']';
    }
    return os;
  }